

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wchar.cpp
# Opt level: O0

char16_t PAL_towlower(char16_t c)

{
  BOOL BVar1;
  UnicodeDataRec local_14;
  UnicodeDataRec dataRec;
  char16_t c_local;
  
  dataRec.nUnicodeValue = c;
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  if ((ushort)c < 0x80) {
    if (((ushort)c < 0x41) || (0x5a < (ushort)c)) {
      dataRec.C1_TYPE_FLAGS = c;
      if (!PAL_InitializeChakraCoreCalled) {
        abort();
      }
    }
    else {
      dataRec.nUnicodeValue = c + L' ';
      dataRec.C1_TYPE_FLAGS = dataRec.nUnicodeValue;
      if (!PAL_InitializeChakraCoreCalled) {
        abort();
      }
    }
  }
  else {
    BVar1 = GetUnicodeData((uint)(ushort)c,&local_14);
    if (BVar1 == 0) {
      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        abort();
      }
      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        abort();
      }
      dataRec.C1_TYPE_FLAGS = dataRec.nUnicodeValue;
    }
    else if (((local_14.C1_TYPE_FLAGS & 2) == 0) && (local_14.nOpposingCase != L'\0')) {
      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        abort();
      }
      dataRec.C1_TYPE_FLAGS = local_14.nOpposingCase;
    }
    else {
      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        abort();
      }
      dataRec.C1_TYPE_FLAGS = dataRec.nUnicodeValue;
    }
  }
  return dataRec.C1_TYPE_FLAGS;
}

Assistant:

char16_t
__cdecl
PAL_towlower( char16_t c )
{
    PERF_ENTRY(towlower);
    ENTRY("towlower (c=%d)\n", c);
    if(c < 128)
    {//fast path for ascii characters
        if(c >= 'A' && c <= 'Z')
        {
            c += ('a' - 'A');
            PERF_EXIT(towlower);
            LOGEXIT("towlower returns int %d\n", c );
            return c;
        }
        else
        {
            PERF_EXIT(towlower);
            LOGEXIT("towlower returns int %d\n", c );
            return c;
        }
    }
    else
    {
    #if HAVE_COREFOUNDATION
        if (!PAL_iswlower(c))
        {
            CFMutableStringRef cfString = CFStringCreateMutable(
                                                kCFAllocatorDefault, 1);
            if (cfString != NULL)
            {
                CFStringAppendCharacters(cfString, (const UniChar*)&c, 1);
                CFStringLowercase(cfString, NULL);
                c = CFStringGetCharacterAtIndex(cfString, 0);
                CFRelease(cfString);
            }
        }
        LOGEXIT("towlower returns int %d\n", c );
        PERF_EXIT(towlower);
        return c;
    #else   /* HAVE_COREFOUNDATION */
        UnicodeDataRec dataRec;

        if (!GetUnicodeData(c, &dataRec))
        {
            TRACE( "Unable to retrieve unicode data for the character %c.\n", c );
            LOGEXIT("towlower returns int %d\n", c );
            PERF_EXIT(towlower);
            return c;
        }

        if ( (dataRec.C1_TYPE_FLAGS & C1_LOWER) || (dataRec.nOpposingCase ==  0 ))
        {
            LOGEXIT("towlower returns int %d\n", c );
            PERF_EXIT(towlower);
            return c;
        }
        else
        {
            LOGEXIT("towlower returns int %d\n", dataRec.nOpposingCase );
            PERF_EXIT(towlower);
            return dataRec.nOpposingCase;
        }
    #endif  /* HAVE_COREFOUNDATION */
    }
}